

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O2

bool __thiscall EventHandler::keyPressed(EventHandler *this,KeyEvent *arg)

{
  int iVar1;
  EWhichEffect eWhich;
  EWhichJoystick eWhich_00;
  ostream *poVar2;
  EffectManager *this_00;
  JoystickManager *pJVar3;
  float dDeltaPercent;
  
  iVar1 = *(int *)(arg + 0x10);
  switch(iVar1) {
  case 200:
    this_00 = this->_pEffectMgr;
    eWhich = eNext;
    break;
  case 0xc9:
    pJVar3 = this->_pJoystickMgr;
    dDeltaPercent = 5.0;
    goto LAB_00107806;
  case 0xcb:
    EffectManager::selectEffect(this->_pEffectMgr,eNone);
    pJVar3 = this->_pJoystickMgr;
    eWhich_00 = ePrevious;
    goto LAB_001077db;
  case 0xcd:
    EffectManager::selectEffect(this->_pEffectMgr,eNone);
    pJVar3 = this->_pJoystickMgr;
    eWhich_00 = eNext;
LAB_001077db:
    JoystickManager::selectJoystick(pJVar3,eWhich_00);
    EffectManager::checkPlayableEffects(this->_pEffectMgr);
    return true;
  case 0xd0:
    this_00 = this->_pEffectMgr;
    eWhich = ePrevious;
    break;
  case 0xd1:
    pJVar3 = this->_pJoystickMgr;
    dDeltaPercent = -5.0;
LAB_00107806:
    JoystickManager::changeMasterGain(pJVar3,dDeltaPercent);
    return true;
  default:
    if (iVar1 == 0x39) {
      JoystickManager::changeAutoCenter(this->_pJoystickMgr,eToggle);
      return true;
    }
    if (iVar1 == 0x23) {
      Application::printHelp(this->_pApplication);
      return true;
    }
    if (iVar1 == 1) {
      this->_pApplication->_bMustStop = true;
      return true;
    }
  case 0xca:
  case 0xcc:
  case 0xce:
  case 0xcf:
    poVar2 = std::operator<<((ostream *)&std::cout,"Non mapped key: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(arg + 0x10));
    std::endl<char,std::char_traits<char>>(poVar2);
    return true;
  }
  EffectManager::selectEffect(this_00,eWhich);
  return true;
}

Assistant:

bool EventHandler::keyPressed(const KeyEvent& arg)
{
	switch(arg.key)
	{
		// Quit.
		case KC_ESCAPE:
			_pApplication->stop();
			break;

		// Help.
		case KC_H:
			_pApplication->printHelp();
			break;

		// Change current joystick.
		case KC_RIGHT:
			_pEffectMgr->selectEffect(EffectManager::eNone);
			_pJoystickMgr->selectJoystick(JoystickManager::eNext);
			_pEffectMgr->checkPlayableEffects();
			break;
		case KC_LEFT:
			_pEffectMgr->selectEffect(EffectManager::eNone);
			_pJoystickMgr->selectJoystick(JoystickManager::ePrevious);
			_pEffectMgr->checkPlayableEffects();
			break;

		// Change current effect.
		case KC_UP:
			_pEffectMgr->selectEffect(EffectManager::eNext);
			break;
		case KC_DOWN:
			_pEffectMgr->selectEffect(EffectManager::ePrevious);
			break;

		// Change current master gain.
		case KC_PGUP:
			_pJoystickMgr->changeMasterGain(5.0); // Percent
			break;
		case KC_PGDOWN:
			_pJoystickMgr->changeMasterGain(-5.0); // Percent
			break;

		// Toggle auto-center mode.
		case KC_SPACE:
			_pJoystickMgr->changeAutoCenter();
			break;

		default:
			cout << "Non mapped key: " << arg.key << endl;
	}
	return true;
}